

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O2

void __thiscall QAnimationGroupPrivate::clear(QAnimationGroupPrivate *this,bool onDestruction)

{
  QObject *this_00;
  qsizetype qVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractAnimation_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (this->animations).d.d;
  local_40.ptr = (this->animations).d.ptr;
  local_40.size = (this->animations).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QAbstractAnimation_*>::clear(&this->animations);
  qVar1 = local_40.size;
  while (0 < qVar1) {
    this_00 = &local_40.ptr[qVar1 + -1]->super_QObject;
    QObject::setParent(this_00,(QObject *)0x0);
    qVar1 = qVar1 + -1;
    (this_00->d_ptr).d[1].bindingStorage.bindingStatus = (QBindingStatus *)0x0;
    if (!onDestruction) {
      (*(this->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.
        _vptr_QObjectData[5])(this,qVar1,this_00);
    }
    (*this_00->_vptr_QObject[4])(this_00);
  }
  QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationGroupPrivate::clear(bool onDestruction)
{
    const QList<QAbstractAnimation *> animationsCopy = animations; // taking a copy
    animations.clear();
    // Clearing backwards so the indices doesn't change while we remove animations.
    for (qsizetype i = animationsCopy.size() - 1; i >= 0; --i) {
        QAbstractAnimation *animation = animationsCopy.at(i);
        animation->setParent(nullptr);
        QAbstractAnimationPrivate::get(animation)->group = nullptr;
        // If we are in ~QAnimationGroup() it is not safe to called the virtual
        // animationRemoved method, which can still be a method in a
        // QAnimationGroupPrivate derived class that assumes q_ptr is still
        // a valid derived class of QAnimationGroup.
        if (!onDestruction)
            animationRemoved(i, animation);
        delete animation;
    }
}